

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcmp_s.c
# Opt level: O3

errno_t memcmp_s(void *dest,rsize_t dmax,void *src,rsize_t smax,int *diff)

{
  long lVar1;
  long lVar2;
  errno_t error;
  errno_t eVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (diff == (int *)0x0) {
    pcVar4 = "memcmp_s: diff is null";
LAB_001024e1:
    eVar3 = 400;
    error = 400;
  }
  else {
    *diff = -1;
    if (dest == (void *)0x0) {
      pcVar4 = "memcmp_s: dest is null";
      goto LAB_001024e1;
    }
    if (src == (void *)0x0) {
      pcVar4 = "memcmp_s: src is null";
      goto LAB_001024e1;
    }
    if (dmax == 0) {
      pcVar4 = "wmemcmp_s: dmax is 0";
LAB_0010253d:
      pcVar4 = pcVar4 + 1;
      eVar3 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        if (smax == 0) {
          pcVar4 = "wmemcmp_s: smax is 0";
          goto LAB_0010253d;
        }
        if (smax <= dmax) {
          *diff = 0;
          if (dest == src) {
            eVar3 = 0;
          }
          else {
            eVar3 = 0;
            lVar2 = 0;
            while( true ) {
              if (*(byte *)((long)dest + lVar2) != *(byte *)((long)src + lVar2)) break;
              if ((dmax - 1 == lVar2) || (bVar5 = smax - 1 == lVar2, lVar2 = lVar2 + 1, bVar5))
              goto LAB_001024f2;
            }
            eVar3 = 0;
            *diff = -(uint)(*(byte *)((long)dest + lVar2) < *(byte *)((long)src + lVar2)) | 1;
          }
          goto LAB_001024f2;
        }
        pcVar4 = "wmemcmp_s: smax exceeds dmax";
      }
      else {
        pcVar4 = "wmemcmp_s: dmax exceeds max";
      }
      pcVar4 = pcVar4 + 1;
      eVar3 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_mem_constraint_handler(pcVar4,(void *)0x0,error);
LAB_001024f2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return eVar3;
}

Assistant:

errno_t
memcmp_s (const void *dest, rsize_t dmax,
          const void *src,  rsize_t smax, int *diff)
{
    const uint8_t *dp;
    const uint8_t *sp;

    dp = dest;
    sp = src;

    /*
     * must be able to return the diff
     */
    if (diff == NULL) {
        invoke_safe_mem_constraint_handler("memcmp_s: diff is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }
    *diff = -1;  /* default diff */

    if (dp == NULL) {
        invoke_safe_mem_constraint_handler("memcmp_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (sp == NULL) {
        invoke_safe_mem_constraint_handler("memcmp_s: src is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcmp_s: dmax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (dmax > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memcmp_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (smax == 0) {
        invoke_safe_mem_constraint_handler("memcmp_s: smax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (smax > dmax) {
        invoke_safe_mem_constraint_handler("memcmp_s: smax exceeds dmax",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    /*
     * no need to compare the same memory
     */
    if (dp == sp) {
        *diff = 0;
        return (RCNEGATE(EOK));
    }

    /*
     * now compare sp to dp
     */
    *diff = 0;
    while (dmax > 0 && smax > 0) {
        if (*dp != *sp) {
            /***  *diff = *dp - *sp; ***/
            *diff = *dp < *sp ? -1 : 1;
            break;
        }

        dmax--;
        smax--;

        dp++;
        sp++;
    }

    return (RCNEGATE(EOK));
}